

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

Am_Object output_obj_or_list(Am_Value *object_modified_value,ostrstream *oss)

{
  bool bVar1;
  ostream *in_RDX;
  Am_Value local_30;
  
  Am_Value::Am_Value(&local_30,(Am_Value *)oss);
  if_list_get_obj(object_modified_value,SUB81(&local_30,0));
  Am_Value::~Am_Value(&local_30);
  bVar1 = Am_Object::Valid((Am_Object *)object_modified_value);
  if (bVar1) {
    operator<<(in_RDX,(Am_Object *)object_modified_value);
  }
  else {
    if (*(short *)oss == -0x5fff) {
      Am_Object::operator=((Am_Object *)object_modified_value,(Am_Value *)oss);
    }
    operator<<(in_RDX,(Am_Value *)oss);
  }
  return (Am_Object)(Am_Object_Data *)object_modified_value;
}

Assistant:

Am_Object
output_obj_or_list(Am_Value &object_modified_value, OSTRSTREAM &oss)
{
  Am_Object object_modified = if_list_get_obj(object_modified_value, true);
  if (object_modified.Valid())
    oss << object_modified;
  else {
    if (object_modified_value.type == Am_OBJECT)
      object_modified = object_modified_value;
    oss << object_modified_value;
  }
  return object_modified;
}